

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **ppcVar1;
  Syntax SVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  
  SVar2 = str->style->syntax;
  ppcVar1 = &str->ptr;
  if (SVar2 - GNU < 2) {
    cVar5 = 'm';
    lVar6 = 0;
    do {
      pcVar4 = *ppcVar1;
      *ppcVar1 = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "fdmove"[lVar6 + 3];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = *ppcVar1;
      *ppcVar1 = pcVar4 + 1;
      *pcVar4 = 'w';
    }
    else {
      cVar5 = '.';
      lVar6 = 0;
      do {
        pcVar4 = *ppcVar1;
        *ppcVar1 = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "$%x.w"[lVar6 + 4];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar3);
      goto LAB_0023e58f;
    }
  }
  else {
    if (SVar2 != MUSASHI) {
      cVar5 = 'm';
      lVar6 = 0;
      do {
        pcVar4 = *ppcVar1;
        *ppcVar1 = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "fdmove"[lVar6 + 3];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if (str->style->syntax - MOIRA_MIT < 3) {
        pcVar4 = *ppcVar1;
        *ppcVar1 = pcVar4 + 1;
        *pcVar4 = 'w';
      }
      else {
        cVar5 = '.';
        lVar6 = 0;
        do {
          pcVar4 = *ppcVar1;
          *ppcVar1 = pcVar4 + 1;
          *pcVar4 = cVar5;
          cVar5 = "$%x.w"[lVar6 + 4];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
      }
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = *ppcVar1;
        *ppcVar1 = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar3 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar3);
      }
      goto LAB_0023e58f;
    }
    cVar5 = 'm';
    lVar6 = 0;
    do {
      pcVar4 = *ppcVar1;
      *ppcVar1 = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "fdmove"[lVar6 + 3];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar3);
      goto LAB_0023e58f;
    }
  }
  pcVar4 = *ppcVar1;
  *ppcVar1 = pcVar4 + 1;
  *pcVar4 = ' ';
LAB_0023e58f:
  StrWriter::operator<<(str,(Dn)(op & 7));
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar4 = *ppcVar1;
    *ppcVar1 = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}